

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

c_explicit * __thiscall
boost::ext::di::v1_3_0::providers::stack_over_heap::
get<c_explicit,boost::ext::di::v1_3_0::core::successful::any_type_1st_ref<c_explicit,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
          (stack_over_heap *this,direct *param_1,heap *param_2,
          any_type_1st_ref<c_explicit,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
          *args)

{
  c_explicit *pcVar1;
  
  pcVar1 = (c_explicit *)operator_new(1);
  core::successful::any_type_1st_ref::operator_cast_to_empty_((any_type_1st_ref *)args);
  pcVar1->called = true;
  return pcVar1;
}

Assistant:

auto get(const type_traits::direct&, const type_traits::heap&, TArgs&&... args) const {
    return new T(static_cast<TArgs&&>(args)...);
  }